

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O0

void lr_grammar::clear_null
               (vector<int,_std::allocator<int>_> *a,vector<int,_std::allocator<int>_> *result,
               int value)

{
  size_type sVar1;
  const_reference pvVar2;
  undefined4 local_20;
  int i;
  int value_local;
  vector<int,_std::allocator<int>_> *result_local;
  vector<int,_std::allocator<int>_> *a_local;
  
  std::vector<int,_std::allocator<int>_>::clear(result);
  local_20 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(a);
    if (sVar1 <= (ulong)(long)local_20) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](a,(long)local_20);
    if (*pvVar2 != value) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](a,(long)local_20);
      std::vector<int,_std::allocator<int>_>::push_back(result,pvVar2);
    }
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void lr_grammar::clear_null(const vector<int>& a, vector<int>& result, int value){
    result.clear();
    for (int i = 0; i < a.size(); i++){
        if (a[i] != value){
            result.push_back(a[i]);
        }
    }

}